

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitFieldDesignator(SyntaxDumper *this,FieldDesignatorSyntax *node)

{
  SyntaxToken local_98;
  SyntaxToken local_50;
  FieldDesignatorSyntax *local_18;
  FieldDesignatorSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (FieldDesignatorSyntax *)this;
  FieldDesignatorSyntax::dotToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  FieldDesignatorSyntax::identifierToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  return Skip;
}

Assistant:

virtual Action visitFieldDesignator(const FieldDesignatorSyntax* node) override
    {
        terminal(node->dotToken(), node);
        terminal(node->identifierToken(), node);
        return Action::Skip;
    }